

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_item(Am_Priority_List *this,Am_Priority_List_Item *item)

{
  Am_Priority_List_Item *item_local;
  Am_Priority_List *this_local;
  
  if (this->current == item) {
    this->current = item->prev;
  }
  if (item->prev == (Am_Priority_List_Item *)0x0) {
    this->head = item->next;
  }
  else {
    item->prev->next = item->next;
  }
  if (item->next == (Am_Priority_List_Item *)0x0) {
    this->tail = item->prev;
  }
  else {
    item->next->prev = item->prev;
  }
  return item;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_item(Am_Priority_List_Item *item)
{
  if (current == item) {
    current = item->prev; // go to prev so when do next on the next
                          // iteration, will do the next item in the list
  }

  if (item->prev)
    item->prev->next = item->next;
  else
    head = item->next;

  if (item->next)
    item->next->prev = item->prev;
  else
    tail = item->prev;
  return item;
}